

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeTypeFunction(ExpressionContext *ctx,SynTypeFunction *syntax)

{
  Allocator *pAVar1;
  TypeBase *pTVar2;
  int iVar3;
  TypeBase *pTVar4;
  undefined4 extraout_var;
  SynBase *this;
  SynCallArgument *node;
  SynFunctionCall *syntax_00;
  ExprBase *pEVar5;
  SynBase *pSVar6;
  IntrusiveList<SynCallArgument> arguments;
  IntrusiveList<SynCallArgument> local_58;
  SynCallArgument *local_48;
  SynCallArgument *pSStack_40;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pTVar4 = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  pAVar1 = ctx->allocator;
  if (pTVar4 == (TypeBase *)0x0) {
    iVar3 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x48);
    this = (SynBase *)CONCAT44(extraout_var_00,iVar3);
    pSVar6 = syntax->returnType;
    SynBase::SynBase(this,10,(syntax->super_SynBase).begin,(syntax->super_SynBase).end);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6b00;
    this[1]._vptr_SynBase = (_func_int **)pSVar6;
    local_58.head = (SynCallArgument *)0x0;
    local_58.tail = (SynCallArgument *)0x0;
    pSVar6 = (syntax->arguments).head;
    if (pSVar6 != (SynBase *)0x0) {
      do {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        node = (SynCallArgument *)CONCAT44(extraout_var_01,iVar3);
        SynBase::SynBase((SynBase *)node,0x18,pSVar6->begin,pSVar6->end);
        (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6a20;
        node->name = (SynIdentifier *)0x0;
        node->value = pSVar6;
        IntrusiveList<SynCallArgument>::push_back(&local_58,node);
        pSVar6 = pSVar6->next;
      } while (pSVar6 != (SynBase *)0x0);
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    syntax_00 = (SynFunctionCall *)CONCAT44(extraout_var_02,iVar3);
    local_48 = local_58.head;
    pSStack_40 = local_58.tail;
    SynBase::SynBase((SynBase *)syntax_00,0x1a,(syntax->super_SynBase).begin,
                     (syntax->super_SynBase).end);
    (syntax_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e7158;
    syntax_00->value = this;
    (syntax_00->aliases).head = (SynBase *)0x0;
    (syntax_00->aliases).tail = (SynBase *)0x0;
    (syntax_00->arguments).head = local_48;
    (syntax_00->arguments).tail = pSStack_40;
    pEVar5 = AnalyzeFunctionCall(ctx,syntax_00);
  }
  else {
    iVar3 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar3);
    pTVar2 = ctx->typeTypeID;
    pEVar5->typeID = 8;
    pEVar5->source = &syntax->super_SynBase;
    pEVar5->type = pTVar2;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6550;
    pEVar5[1]._vptr_ExprBase = (_func_int **)pTVar4;
  }
  return pEVar5;
}

Assistant:

ExprBase* AnalyzeTypeFunction(ExpressionContext &ctx, SynTypeFunction *syntax)
{
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);

	// Transform 'type ref(arguments)' into a 'type ref' constructor call
	SynBase* value = new (ctx.get<SynTypeReference>()) SynTypeReference(syntax->begin, syntax->end, syntax->returnType);

	IntrusiveList<SynCallArgument> arguments;

	for(SynBase *curr = syntax->arguments.head; curr; curr = curr->next)
		arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(curr->begin, curr->end, NULL, curr));

	return AnalyzeFunctionCall(ctx, new (ctx.get<SynFunctionCall>()) SynFunctionCall(syntax->begin, syntax->end, value, IntrusiveList<SynBase>(), arguments));
}